

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

ushort __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::BuildFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,SmallHeapBlockBitVector *free)

{
  code *pcVar1;
  anon_class_24_3_be079e9c fn;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  BVIndex BVar5;
  uint uVar6;
  undefined4 *puVar7;
  FreeObject *this_01;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_02;
  ushort uVar8;
  SmallHeapBlockBitVector *local_50;
  SmallHeapBlockBitVector *free_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *local_40;
  ushort local_32;
  
  free->data[2].word = 0;
  free->data[3].word = 0;
  free->data[0].word = 0;
  free->data[1].word = 0;
  this_01 = this->freeObjectList;
  local_50 = free;
  local_40 = this;
  if (this_01 == (FreeObject *)0x0) {
    uVar8 = 0;
  }
  else {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    free_local = &this->debugFreeBits;
    uVar8 = 0;
    do {
      if (((ulong)this_01 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar2) goto LAB_006a94e5;
        *puVar7 = 0;
      }
      uVar6 = (uint)((ulong)this_01 >> 4) & 0xff;
      bVar2 = IsValidBitIndex(local_40,uVar6);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x766,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar2) goto LAB_006a94e5;
        *puVar7 = 0;
      }
      BVar3 = BVStatic<256UL>::Test(free_local,uVar6);
      if (BVar3 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x767,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar2) goto LAB_006a94e5;
        *puVar7 = 0;
      }
      BVStatic<256UL>::Set(free,uVar6);
      uVar8 = uVar8 + 1;
      this_01 = FreeObject::GetNext(this_01);
    } while (this_01 != (FreeObject *)0x0);
  }
  this_00 = local_40;
  local_32 = uVar8;
  BVar5 = BVStatic<256UL>::Count(&local_40->debugFreeBits);
  if (BVar5 != uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x76c,"(this->GetDebugFreeBitVector()->Count() == freeCount)",
                       "this->GetDebugFreeBitVector()->Count() == freeCount");
    if (!bVar2) goto LAB_006a94e5;
    *puVar7 = 0;
  }
  uVar6 = (uint)(this_00->super_HeapBlock).heapBlockType;
  if ((uVar6 < 0xb) && ((0x528U >> (uVar6 & 0x1f) & 1) != 0)) {
    this_02 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                        (&this_00->super_HeapBlock);
    fn.free = &local_50;
    fn.this = this_00;
    fn.freeCount = &local_32;
    SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::BuildFreeBitVector(BVStatic<256ul>*)::_lambda(unsigned_int)_1_>
              (this_02,fn);
    uVar4 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
            AddDisposedObjectFreeBitVector(this_02,local_50);
    uVar8 = uVar4 + local_32;
    local_32 = uVar8;
  }
  if (this_00->lastFreeCount < uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x77f,"(freeCount <= this->lastFreeCount)",
                       "freeCount <= this->lastFreeCount");
    if (!bVar2) {
LAB_006a94e5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
    uVar8 = local_32;
  }
  return uVar8;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::BuildFreeBitVector(SmallHeapBlockBitVector * free)
{
    free->ClearAll();
    ushort freeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        free->Set(bitIndex);
        freeCount++;
        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == freeCount);

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            free->Set(bitIndex);
            freeCount++;
        });

        // Include disposed objects
        freeCount += finalizableBlock->AddDisposedObjectFreeBitVector(free);
    }

    Assert(freeCount <= this->lastFreeCount);
    return freeCount;
}